

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_job_pool.hpp
# Opt level: O2

mmap_disk_job * __thiscall
libtorrent::aux::disk_job_pool<libtorrent::aux::mmap_disk_job>::
allocate_job<libtorrent::aux::job::clear_piece,std::shared_ptr<libtorrent::aux::mmap_storage>,std::function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>)>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
          (disk_job_pool<libtorrent::aux::mmap_disk_job> *this,disk_job_flags_t flags,
          shared_ptr<libtorrent::aux::mmap_storage> *stor,
          function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)>
          *args,strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *args_1)

{
  _Manager_type p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  mmap_disk_job *this_00;
  _Any_data local_d8;
  _Manager_type local_c8;
  _Invoker_type local_c0;
  int local_b8;
  disk_job local_b0;
  
  ::std::mutex::lock(&this->m_job_mutex);
  this_00 = (mmap_disk_job *)
            boost::pool<libtorrent::aux::allocator_new_delete>::ordered_malloc
                      (&(this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>);
  local_b0.super_tailqueue_node<libtorrent::aux::disk_job>.next = (disk_job *)0x0;
  local_b0.ret.m_val = '\0';
  local_b0.error.ec.val_ = 0;
  local_b0.error.ec.failed_ = false;
  local_b0.error.ec.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_b0.error._16_3_ = 0xffffff;
  local_b0.error.operation = unknown;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (_Manager_type)0x0;
  local_c0 = args->_M_invoker;
  p_Var1 = (args->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_d8._M_unused._0_8_ = (undefined8)*(undefined8 *)&(args->super__Function_base)._M_functor;
    local_d8._8_8_ = *(undefined8 *)((long)&(args->super__Function_base)._M_functor + 8);
    (args->super__Function_base)._M_manager = (_Manager_type)0x0;
    args->_M_invoker = (_Invoker_type)0x0;
    local_c8 = p_Var1;
  }
  local_b8 = args_1->m_val;
  local_b0.flags.m_val = flags.m_val;
  ::std::
  variant<libtorrent::aux::job::read,libtorrent::aux::job::write,libtorrent::aux::job::hash,libtorrent::aux::job::hash2,libtorrent::aux::job::move_storage,libtorrent::aux::job::release_files,libtorrent::aux::job::delete_files,libtorrent::aux::job::check_fastresume,libtorrent::aux::job::rename_file,libtorrent::aux::job::stop_torrent,libtorrent::aux::job::file_priority,libtorrent::aux::job::clear_piece,libtorrent::aux::job::partial_read>
  ::variant<libtorrent::aux::job::clear_piece,void,void,libtorrent::aux::job::clear_piece,void>
            ((variant<libtorrent::aux::job::read,libtorrent::aux::job::write,libtorrent::aux::job::hash,libtorrent::aux::job::hash2,libtorrent::aux::job::move_storage,libtorrent::aux::job::release_files,libtorrent::aux::job::delete_files,libtorrent::aux::job::check_fastresume,libtorrent::aux::job::rename_file,libtorrent::aux::job::stop_torrent,libtorrent::aux::job::file_priority,libtorrent::aux::job::clear_piece,libtorrent::aux::job::partial_read>
              *)&local_b0.action,(clear_piece *)&local_d8);
  disk_job::disk_job((disk_job *)this_00,&local_b0);
  (this_00->storage).super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var3 = (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->storage).super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (this_00->storage).super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  ::std::__detail::__variant::
  _Variant_storage<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
  ::~_Variant_storage((_Variant_storage<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                       *)&local_b0.action);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  (this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>.start_size = 100;
  (this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>.next_size = 100;
  this->m_jobs_in_use = this->m_jobs_in_use + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_job_mutex);
  return this_00;
}

Assistant:

T* allocate_job(
			disk_job_flags_t const flags
			, Storage stor
			, Args&&... args)
		{
			std::lock_guard<std::mutex> l(m_job_mutex);
			auto* ptr = m_job_pool.malloc();
			new (ptr) T{
				disk_job{
				tailqueue_node<disk_job>{},
				flags,
				status_t{},
				storage_error{},
				JobType{std::forward<Args>(args)...},
#if TORRENT_USE_ASSERTS
				true, // in_use
				false, // job_posted
				false, // callback_called
				false, // blocked
#endif
				},
				std::move(stor)};
			m_job_pool.set_next_size(100);
			++m_jobs_in_use;
			if constexpr (std::is_same_v<JobType, job::read>)
				++m_read_jobs;
			else if constexpr (std::is_same_v<JobType, job::write>)
				++m_write_jobs;

			return ptr;
		}